

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaterialSystem.cpp
# Opt level: O1

aiReturn aiGetMaterialTexture
                   (aiMaterial *mat,aiTextureType type,uint index,aiString *path,
                   aiTextureMapping *_mapping,uint *uvindex,ai_real *blend,aiTextureOp *op,
                   aiTextureMapMode *mapmode,uint *flags)

{
  uint in_EAX;
  aiReturn aVar1;
  aiReturn aVar2;
  int mapping_;
  undefined8 uStack_38;
  
  if (mat == (aiMaterial *)0x0) {
    __assert_fail("__null != mat",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Material/MaterialSystem.cpp"
                  ,0x166,
                  "aiReturn aiGetMaterialTexture(const aiMaterial *, aiTextureType, unsigned int, aiString *, aiTextureMapping *, unsigned int *, ai_real *, aiTextureOp *, aiTextureMapMode *, unsigned int *)"
                 );
  }
  if (path != (aiString *)0x0) {
    uStack_38._0_4_ = in_EAX;
    aVar1 = aiGetMaterialString(mat,"$tex.file",type,index,path);
    aVar2 = aiReturn_FAILURE;
    if (aVar1 == aiReturn_SUCCESS) {
      uStack_38 = (ulong)(uint)uStack_38;
      aiGetMaterialIntegerArray
                (mat,"$tex.mapping",type,index,(int *)((long)&uStack_38 + 4),(uint *)0x0);
      if (_mapping != (aiTextureMapping *)0x0) {
        *_mapping = uStack_38._4_4_;
      }
      if (uvindex != (uint *)0x0 && uStack_38._4_4_ == aiTextureMapping_UV) {
        aiGetMaterialIntegerArray(mat,"$tex.uvwsrc",type,index,(int *)uvindex,(uint *)0x0);
      }
      if (blend != (ai_real *)0x0) {
        aiGetMaterialFloatArray(mat,"$tex.blend",type,index,blend,(uint *)0x0);
      }
      if (op != (aiTextureOp *)0x0) {
        aiGetMaterialIntegerArray(mat,"$tex.op",type,index,(int *)op,(uint *)0x0);
      }
      if (mapmode != (aiTextureMapMode *)0x0) {
        aiGetMaterialIntegerArray(mat,"$tex.mapmodeu",type,index,(int *)mapmode,(uint *)0x0);
        aiGetMaterialIntegerArray(mat,"$tex.mapmodev",type,index,(int *)(mapmode + 1),(uint *)0x0);
      }
      if (flags != (uint *)0x0) {
        aiGetMaterialIntegerArray(mat,"$tex.flags",type,index,(int *)flags,(uint *)0x0);
      }
      aVar2 = aiReturn_SUCCESS;
    }
    return aVar2;
  }
  __assert_fail("__null != path",
                "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Material/MaterialSystem.cpp"
                ,0x167,
                "aiReturn aiGetMaterialTexture(const aiMaterial *, aiTextureType, unsigned int, aiString *, aiTextureMapping *, unsigned int *, ai_real *, aiTextureOp *, aiTextureMapMode *, unsigned int *)"
               );
}

Assistant:

aiReturn aiGetMaterialTexture(const C_STRUCT aiMaterial* mat,
    aiTextureType type,
    unsigned int  index,
    C_STRUCT aiString* path,
    aiTextureMapping* _mapping  /*= NULL*/,
    unsigned int* uvindex       /*= NULL*/,
    ai_real* blend              /*= NULL*/,
    aiTextureOp* op             /*= NULL*/,
    aiTextureMapMode* mapmode   /*= NULL*/,
    unsigned int* flags         /*= NULL*/
    )
{
    ai_assert( NULL != mat );
    ai_assert( NULL != path );

    // Get the path to the texture
    if (AI_SUCCESS != aiGetMaterialString(mat,AI_MATKEY_TEXTURE(type,index),path))  {
        return AI_FAILURE;
    }

    // Determine mapping type
    int mapping_ = static_cast<int>(aiTextureMapping_UV);
    aiGetMaterialInteger(mat,AI_MATKEY_MAPPING(type,index), &mapping_);
    aiTextureMapping mapping = static_cast<aiTextureMapping>(mapping_);
    if (_mapping)
        *_mapping = mapping;

    // Get UV index
    if (aiTextureMapping_UV == mapping && uvindex)  {
        aiGetMaterialInteger(mat,AI_MATKEY_UVWSRC(type,index),(int*)uvindex);
    }
    // Get blend factor
    if (blend)  {
        aiGetMaterialFloat(mat,AI_MATKEY_TEXBLEND(type,index),blend);
    }
    // Get texture operation
    if (op){
        aiGetMaterialInteger(mat,AI_MATKEY_TEXOP(type,index),(int*)op);
    }
    // Get texture mapping modes
    if (mapmode)    {
        aiGetMaterialInteger(mat,AI_MATKEY_MAPPINGMODE_U(type,index),(int*)&mapmode[0]);
        aiGetMaterialInteger(mat,AI_MATKEY_MAPPINGMODE_V(type,index),(int*)&mapmode[1]);
    }
    // Get texture flags
    if (flags){
        aiGetMaterialInteger(mat,AI_MATKEY_TEXFLAGS(type,index),(int*)flags);
    }

    return AI_SUCCESS;
}